

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlWriter::writeEncodedText(XmlWriter *this,string *text)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  string mtext;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&mtext,(string *)text);
  lVar3 = std::__cxx11::string::find_first_of((char *)&mtext,(ulong)writeEncodedText::charsToEncode)
  ;
  do {
    poVar2 = this->m_os;
    if (lVar3 == -1) {
      std::operator<<(poVar2,(string *)&mtext);
      std::__cxx11::string::~string((string *)&mtext);
      return;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&mtext);
    std::operator<<(poVar2,local_50);
    std::__cxx11::string::~string(local_50);
    cVar1 = mtext._M_dataplus._M_p[lVar3];
    if (cVar1 == '\"') {
      pcVar4 = "&quot;";
LAB_0015d246:
      std::operator<<(this->m_os,pcVar4);
    }
    else {
      pcVar4 = "&amp;";
      if (cVar1 == '&') goto LAB_0015d246;
      if (cVar1 == '<') {
        pcVar4 = "&lt;";
        goto LAB_0015d246;
      }
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&mtext);
    std::__cxx11::string::operator=((string *)&mtext,local_50);
    std::__cxx11::string::~string(local_50);
    lVar3 = std::__cxx11::string::find_first_of
                      ((char *)&mtext,(ulong)writeEncodedText::charsToEncode);
  } while( true );
}

Assistant:

void writeEncodedText( std::string const& text ) {
            static const char* charsToEncode = "<&\"";
            std::string mtext = text;
            std::string::size_type pos = mtext.find_first_of( charsToEncode );
            while( pos != std::string::npos ) {
                stream() << mtext.substr( 0, pos );

                switch( mtext[pos] ) {
                    case '<':
                        stream() << "&lt;";
                        break;
                    case '&':
                        stream() << "&amp;";
                        break;
                    case '\"':
                        stream() << "&quot;";
                        break;
                }
                mtext = mtext.substr( pos+1 );
                pos = mtext.find_first_of( charsToEncode );
            }
            stream() << mtext;
        }